

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListView::scrollTo(QListView *this,QModelIndex *index,ScrollHint hint)

{
  QListViewPrivate *this_00;
  QRect QVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Flow FVar5;
  QScrollBar *pQVar6;
  long in_FS_OFFSET;
  QRect local_58;
  undefined1 local_48 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QModelIndex::parent((QModelIndex *)local_48,index);
  bVar2 = ::operator!=((QModelIndex *)local_48,&(this_00->super_QAbstractItemViewPrivate).root);
  QVar1.x2.m_i = local_48._8_4_;
  QVar1.y2.m_i = local_48._12_4_;
  QVar1.x1.m_i = local_48._0_4_;
  QVar1.y1.m_i = local_48._4_4_;
  if ((!bVar2) && (local_48 = (undefined1  [16])QVar1, index->c == this_00->column)) {
    local_48 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget + 0x1e0))(this,index);
    if ((local_48._0_4_ <= local_48._8_4_) && (local_48._4_4_ <= local_48._12_4_)) {
      if (hint == EnsureVisible) {
        local_58 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.viewport);
        cVar3 = QRect::contains(&local_58,SUB81(local_48,0));
        if (cVar3 != '\0') {
          QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                          .viewport,(QRect *)local_48);
          goto LAB_00511596;
        }
      }
      FVar5 = this_00->flow;
      if ((FVar5 == TopToBottom) || (this_00->wrap == true)) {
        pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
        iVar4 = QListViewPrivate::verticalScrollToValue(this_00,index,(QRect *)local_48,hint);
        QAbstractSlider::setValue(&pQVar6->super_QAbstractSlider,iVar4);
        FVar5 = this_00->flow;
      }
      if ((FVar5 == LeftToRight) || (this_00->wrap == true)) {
        pQVar6 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
        iVar4 = QListViewPrivate::horizontalScrollToValue(this_00,index,(QRect *)local_48,hint);
        QAbstractSlider::setValue(&pQVar6->super_QAbstractSlider,iVar4);
      }
    }
  }
LAB_00511596:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QListView);

    if (index.parent() != d->root || index.column() != d->column)
        return;

    const QRect rect = visualRect(index);
    if (!rect.isValid())
        return;
    if (hint == EnsureVisible && d->viewport->rect().contains(rect)) {
        d->viewport->update(rect);
        return;
    }

    if (d->flow == QListView::TopToBottom || d->isWrapping()) // vertical
        verticalScrollBar()->setValue(d->verticalScrollToValue(index, rect, hint));

    if (d->flow == QListView::LeftToRight || d->isWrapping()) // horizontal
        horizontalScrollBar()->setValue(d->horizontalScrollToValue(index, rect, hint));
}